

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O2

void __thiscall deci::parser_t::yypush_(parser_t *this,char *m,stack_symbol_type *sym)

{
  ostream *poVar1;
  
  if ((m != (char *)0x0) && (this->yydebug_ != 0)) {
    poVar1 = std::operator<<(this->yycdebug_,m);
    std::operator<<(poVar1,' ');
    yy_print_<deci::parser_t::by_state>
              (this,this->yycdebug_,&sym->super_basic_symbol<deci::parser_t::by_state>);
    std::operator<<(this->yycdebug_,'\n');
  }
  stack<deci::parser_t::stack_symbol_type,_std::vector<deci::parser_t::stack_symbol_type,_std::allocator<deci::parser_t::stack_symbol_type>_>_>
  ::push(&this->yystack_,sym);
  return;
}

Assistant:

void
   parser_t ::yypush_ (const char* m, YY_MOVE_REF (stack_symbol_type) sym)
  {
    if (m)
      YY_SYMBOL_PRINT (m, sym);
    yystack_.push (YY_MOVE (sym));
  }